

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t httplib::detail::send_socket(socket_t sock,void *ptr,size_t size,int flags)

{
  anon_class_32_4_210d28e3 fn;
  ssize_t sVar1;
  undefined8 in_stack_ffffffffffffffb8;
  undefined1 local_1c [12];
  int local_10 [3];
  undefined1 local_4 [4];
  
  fn.ptr = (void **)in_stack_ffffffffffffffb8;
  fn.sock = (socket_t *)local_1c;
  fn.size = (size_t *)local_4;
  fn.flags = local_10;
  sVar1 = handle_EINTR<httplib::detail::send_socket(int,void_const*,unsigned_long,int)::_lambda()_1_>
                    (fn);
  return sVar1;
}

Assistant:

inline ssize_t send_socket(socket_t sock, const void* ptr, size_t size,
            int flags) {
            return handle_EINTR([&]() {
                return send(sock,
                #ifdef _WIN32
                    static_cast<const char*>(ptr), static_cast<int>(size),
                #else
                    ptr, size,
                #endif
                    flags);
            });
        }